

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[10],unsigned_short&,char_const(&)[3],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_short *params_1,
          char (*params_2) [3],StringTree *params_3)

{
  CappedArray<char,_8UL> local_58;
  CappedArray<char,_8UL> local_48;
  ArrayPtr<const_char> local_38;
  
  local_38 = toCharSequence<char_const(&)[10]>((char (*) [10])this);
  local_48 = toCharSequence<unsigned_short&>((unsigned_short *)params);
  local_58 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&local_38,(ArrayPtr<const_char> *)&local_48,
             &local_58,(ArrayPtr<const_char> *)params_2,params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}